

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int VP8LDecodeAlphaHeader(ALPHDecoder *alph_dec,uint8_t *data,size_t data_size)

{
  HTreeGroup *pHVar1;
  int iVar2;
  VP8LDecoder *dec;
  uint32_t *puVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  dec = VP8LNew();
  if (dec == (VP8LDecoder *)0x0) {
    return 0;
  }
  iVar2 = alph_dec->width;
  dec->width = iVar2;
  iVar6 = alph_dec->height;
  dec->height = iVar6;
  dec->io = &alph_dec->io;
  (alph_dec->io).opaque = alph_dec;
  (alph_dec->io).width = iVar2;
  (alph_dec->io).height = iVar6;
  dec->status = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br,data,data_size);
  iVar6 = 0;
  iVar2 = DecodeImageStream(alph_dec->width,alph_dec->height,1,dec,(uint32_t **)0x0);
  if (iVar2 == 0) {
LAB_001127ad:
    VP8LClear(dec);
    WebPSafeFree(dec);
  }
  else {
    if (((dec->next_transform == 1) && (dec->transforms[0].type == COLOR_INDEXING_TRANSFORM)) &&
       ((dec->hdr).color_cache_size < 1)) {
      lVar4 = (long)(dec->hdr).num_htree_groups;
      if (0 < lVar4) {
        pHVar1 = (dec->hdr).htree_groups;
        lVar5 = 0;
        do {
          if (((**(char **)((long)pHVar1->htrees + lVar5 + 8) != '\0') ||
              (**(char **)((long)pHVar1->htrees + lVar5 + 0x10) != '\0')) ||
             (**(char **)((long)pHVar1->htrees + lVar5 + 0x18) != '\0')) goto LAB_001126e5;
          lVar5 = lVar5 + 0x238;
        } while (lVar4 * 0x238 - lVar5 != 0);
      }
      alph_dec->use_8b_decode = 1;
      dec->argb_cache = (uint32_t *)0x0;
      puVar3 = (uint32_t *)WebPSafeMalloc((long)dec->height * (long)dec->width,1);
      dec->pixels = puVar3;
      if (puVar3 == (uint32_t *)0x0) {
        if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
          dec->status = VP8_STATUS_OUT_OF_MEMORY;
        }
        goto LAB_001127ad;
      }
    }
    else {
LAB_001126e5:
      alph_dec->use_8b_decode = 0;
      iVar2 = AllocateInternalBuffers32b(dec,alph_dec->width);
      if (iVar2 == 0) goto LAB_001127ad;
    }
    alph_dec->vp8l_dec = dec;
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int VP8LDecodeAlphaHeader(ALPHDecoder* const alph_dec,
                          const uint8_t* const data, size_t data_size) {
  int ok = 0;
  VP8LDecoder* dec = VP8LNew();

  if (dec == NULL) return 0;

  assert(alph_dec != NULL);

  dec->width = alph_dec->width;
  dec->height = alph_dec->height;
  dec->io = &alph_dec->io;
  dec->io->opaque = alph_dec;
  dec->io->width = alph_dec->width;
  dec->io->height = alph_dec->height;

  dec->status = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br, data, data_size);

  if (!DecodeImageStream(alph_dec->width, alph_dec->height, /*is_level0=*/1,
                         dec, /*decoded_data=*/NULL)) {
    goto Err;
  }

  // Special case: if alpha data uses only the color indexing transform and
  // doesn't use color cache (a frequent case), we will use DecodeAlphaData()
  // method that only needs allocation of 1 byte per pixel (alpha channel).
  if (dec->next_transform == 1 &&
      dec->transforms[0].type == COLOR_INDEXING_TRANSFORM &&
      Is8bOptimizable(&dec->hdr)) {
    alph_dec->use_8b_decode = 1;
    ok = AllocateInternalBuffers8b(dec);
  } else {
    // Allocate internal buffers (note that dec->width may have changed here).
    alph_dec->use_8b_decode = 0;
    ok = AllocateInternalBuffers32b(dec, alph_dec->width);
  }

  if (!ok) goto Err;

  // Only set here, once we are sure it is valid (to avoid thread races).
  alph_dec->vp8l_dec = dec;
  return 1;

 Err:
  VP8LDelete(dec);
  return 0;
}